

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O3

void __thiscall cmCMakePresetsGraph::PackagePreset::~PackagePreset(PackagePreset *this)

{
  ~PackagePreset(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

~PackagePreset() override = default;